

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

Expression *
slang::ast::MemberAccessExpression::fromSyntax
          (Compilation *compilation,MemberAccessExpressionSyntax *syntax,
          InvocationExpressionSyntax *invocation,ArrayOrRandomizeMethodExpressionSyntax *withClause,
          ASTContext *context)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  bool bVar1;
  bitmask<slang::ast::ASTFlags> extraFlags;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  Compilation *in_RDI;
  SourceLocation in_R8;
  SourceRange SVar2;
  Diagnostic *diag;
  Expression *result;
  MemberSelector selector;
  Expression *lhs;
  string_view name;
  undefined1 in_stack_0000025f;
  ASTContext *in_stack_00000260;
  ArrayOrRandomizeMethodExpressionSyntax *in_stack_00000268;
  InvocationExpressionSyntax *in_stack_00000270;
  MemberSelector *in_stack_00000278;
  Expression *in_stack_00000280;
  Compilation *in_stack_00000288;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffeec;
  Compilation *in_stack_fffffffffffffef0;
  SourceLocation in_stack_fffffffffffffef8;
  Token *in_stack_ffffffffffffff00;
  SourceLocation SVar4;
  DiagCode code;
  undefined1 in_stack_ffffffffffffff20 [16];
  SyntaxNode *in_stack_ffffffffffffff40;
  bitmask<slang::ast::ASTFlags> local_50;
  Expression *local_48;
  string_view local_40;
  SourceLocation local_30;
  long local_28;
  long local_20;
  long local_18;
  Compilation *local_10;
  Expression *local_8;
  
  code = in_stack_ffffffffffffff20._4_4_;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_40 = parsing::Token::valueText(in_stack_ffffffffffffff00);
  extraFlags.m_bits =
       (underlying_type)
       not_null<slang::syntax::ExpressionSyntax_*>::operator*
                 ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa3a1ee);
  SVar4 = local_30;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_50,None);
  local_48 = Expression::selfDetermined
                       (local_10,(ExpressionSyntax *)in_stack_ffffffffffffff00,
                        (ASTContext *)in_stack_fffffffffffffef8,extraFlags);
  bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffef0);
  if ((bVar1) ||
     (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_40), bVar1)) {
    local_8 = Expression::badExpr(in_stack_fffffffffffffef0,
                                  (Expression *)
                                  CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  }
  else {
    LookupResult::MemberSelector::MemberSelector((MemberSelector *)in_stack_fffffffffffffef0);
    parsing::Token::location((Token *)(local_18 + 0x20));
    parsing::Token::range((Token *)extraFlags.m_bits);
    uVar3 = 0;
    local_8 = fromSelector(in_stack_00000288,in_stack_00000280,in_stack_00000278,in_stack_00000270,
                           in_stack_00000268,in_stack_00000260,(bool)in_stack_0000025f);
    if ((local_8->kind != Call) &&
       (bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffef0), !bVar1)) {
      if (local_20 == 0) {
        if (local_28 != 0) {
          SVar2 = parsing::Token::range((Token *)extraFlags.m_bits);
          sourceRange_00.endLoc = SVar4;
          sourceRange_00.startLoc = (SourceLocation)extraFlags.m_bits;
          ASTContext::addDiag((ASTContext *)local_10,SVar2.startLoc._4_4_,sourceRange_00);
        }
      }
      else {
        slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff40);
        sourceRange.endLoc = SVar4;
        sourceRange.startLoc = (SourceLocation)extraFlags.m_bits;
        ASTContext::addDiag((ASTContext *)local_10,code,sourceRange);
        SVar2.endLoc = local_30;
        SVar2.startLoc = in_stack_fffffffffffffef8;
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffef0,SVar2);
        local_8 = Expression::badExpr(in_stack_fffffffffffffef0,
                                      (Expression *)CONCAT44(in_stack_fffffffffffffeec,uVar3));
      }
    }
  }
  return local_8;
}

Assistant:

Expression& MemberAccessExpression::fromSyntax(
    Compilation& compilation, const MemberAccessExpressionSyntax& syntax,
    const InvocationExpressionSyntax* invocation,
    const ArrayOrRandomizeMethodExpressionSyntax* withClause, const ASTContext& context) {

    auto name = syntax.name.valueText();
    Expression& lhs = selfDetermined(compilation, *syntax.left, context);
    if (lhs.bad() || name.empty())
        return badExpr(compilation, &lhs);

    LookupResult::MemberSelector selector;
    selector.name = name;
    selector.dotLocation = syntax.dot.location();
    selector.nameRange = syntax.name.range();

    auto& result = fromSelector(compilation, lhs, selector, invocation, withClause, context,
                                /* isFromLookupChain */ false);

    if (result.kind != ExpressionKind::Call && !result.bad()) {
        if (invocation) {
            auto& diag = context.addDiag(diag::ExpressionNotCallable, invocation->sourceRange());
            diag << selector.nameRange;
            return badExpr(compilation, &result);
        }

        if (withClause)
            context.addDiag(diag::UnexpectedWithClause, withClause->with.range());
    }

    return result;
}